

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrcase.cpp
# Opt level: O2

int32_t icu_63::anon_unknown_9::checkOverflowAndEditsError
                  (int32_t destIndex,int32_t destCapacity,Edits *edits,UErrorCode *errorCode)

{
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (destCapacity < destIndex) {
      *errorCode = U_BUFFER_OVERFLOW_ERROR;
    }
    else if (edits != (Edits *)0x0) {
      Edits::copyErrorTo(edits,errorCode);
    }
  }
  return destIndex;
}

Assistant:

int32_t checkOverflowAndEditsError(int32_t destIndex, int32_t destCapacity,
                                   Edits *edits, UErrorCode &errorCode) {
    if (U_SUCCESS(errorCode)) {
        if (destIndex > destCapacity) {
            errorCode = U_BUFFER_OVERFLOW_ERROR;
        } else if (edits != NULL) {
            edits->copyErrorTo(errorCode);
        }
    }
    return destIndex;
}